

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

PClassActor * __thiscall AActor::GetBloodType(AActor *this,int type)

{
  MetaClass *pMVar1;
  FName local_34;
  FName local_30;
  FName local_2c;
  PClassActor *local_28;
  PClassActor *bloodcls;
  AActor *pAStack_18;
  int type_local;
  AActor *this_local;
  
  bloodcls._4_4_ = type;
  pAStack_18 = this;
  if (type == 0) {
    pMVar1 = GetClass(this);
    FName::FName(&local_2c,&pMVar1->BloodType);
    local_28 = PClass::FindActor(&local_2c);
  }
  else if (type == 1) {
    pMVar1 = GetClass(this);
    FName::FName(&local_30,&pMVar1->BloodType2);
    local_28 = PClass::FindActor(&local_30);
  }
  else {
    if (type != 2) {
      return (PClassActor *)0x0;
    }
    pMVar1 = GetClass(this);
    FName::FName(&local_34,&pMVar1->BloodType3);
    local_28 = PClass::FindActor(&local_34);
  }
  if (local_28 != (PClassActor *)0x0) {
    local_28 = PClassActor::GetReplacement(local_28,true);
  }
  return local_28;
}

Assistant:

PClassActor *GetBloodType(int type = 0) const
	{
		PClassActor *bloodcls;
		if (type == 0)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType);
		}
		else if (type == 1)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType2);
		}
		else if (type == 2)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType3);
		}
		else
		{
			return NULL;
		}

		if (bloodcls != NULL)
		{
			bloodcls = bloodcls->GetReplacement();
		}
		return bloodcls;
	}